

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tools_common.c
# Opt level: O2

char * image_format_to_string(aom_img_fmt_t fmt)

{
  switch(fmt) {
  case AOM_IMG_FMT_I420:
    return "I420";
  case 0x103:
  case AOM_IMG_FMT_AOMI420:
    goto switchD_00120d9c_caseD_103;
  case AOM_IMG_FMT_I422:
    return "I422";
  case AOM_IMG_FMT_I444:
    return "I444";
  case AOM_IMG_FMT_NV12:
    return "NV12";
  default:
    if (fmt == AOM_IMG_FMT_YV12) {
      return "YV12";
    }
    if (fmt == AOM_IMG_FMT_I42016) {
      return "I42016";
    }
    if (fmt == AOM_IMG_FMT_I42216) {
      return "I42216";
    }
    if (fmt == AOM_IMG_FMT_I44416) {
      return "I44416";
    }
    if (fmt == AOM_IMG_FMT_YV1216) {
      return "YV1216";
    }
switchD_00120d9c_caseD_103:
    return "Other";
  }
}

Assistant:

const char *image_format_to_string(aom_img_fmt_t fmt) {
  switch (fmt) {
    case AOM_IMG_FMT_I420: return "I420";
    case AOM_IMG_FMT_I422: return "I422";
    case AOM_IMG_FMT_I444: return "I444";
    case AOM_IMG_FMT_YV12: return "YV12";
    case AOM_IMG_FMT_NV12: return "NV12";
    case AOM_IMG_FMT_YV1216: return "YV1216";
    case AOM_IMG_FMT_I42016: return "I42016";
    case AOM_IMG_FMT_I42216: return "I42216";
    case AOM_IMG_FMT_I44416: return "I44416";
    default: return "Other";
  }
}